

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t exr_uncompress_chunk(exr_decode_pipeline_t *decode)

{
  void *unpackbufptr;
  long in_RDI;
  uint64_t sampsize;
  exr_priv_part_t part;
  exr_context_t ctxt;
  exr_result_t rv;
  void *in_stack_ffffffffffffffd0;
  size_t packsz;
  void *packbufptr;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == 0) {
    eVar1 = 2;
  }
  else {
    *(undefined8 *)(in_RDI + 0x68) = 0;
    packbufptr = *(void **)(in_RDI + 0x18);
    if (packbufptr == (void *)0x0) {
      eVar1 = 2;
    }
    else if ((*(int *)(in_RDI + 0x14) < 0) ||
            (*(int *)((long)packbufptr + 0xc4) <= *(int *)(in_RDI + 0x14))) {
      eVar1 = (**(code **)((long)packbufptr + 0x48))
                        (packbufptr,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14))
      ;
    }
    else {
      packsz = *(size_t *)(*(long *)((long)packbufptr + 0x1d8) + (long)*(int *)(in_RDI + 0x14) * 8);
      if (*(long *)(in_RDI + 0x98) != 0) {
        unpackbufptr = (void *)((long)*(int *)(in_RDI + 0x30) * (long)*(int *)(in_RDI + 0x2c) * 4);
        in_stack_ffffffffffffffd0 = unpackbufptr;
        eVar1 = decompress_data((exr_const_context_t)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (exr_compression_t)((ulong)in_RDI >> 0x20),
                                (exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffe8,packbufptr
                                ,packsz,unpackbufptr,(size_t)part);
        if (eVar1 != 0) {
          eVar1 = (**(code **)((long)packbufptr + 0x48))
                            (packbufptr,eVar1,"Unable to decompress sample table %lu -> %lu",
                             *(undefined8 *)(in_RDI + 0x58),in_stack_ffffffffffffffd0,
                             *(code **)((long)packbufptr + 0x48),unpackbufptr);
          return eVar1;
        }
      }
      eVar1 = 0;
      if ((*(ushort *)(in_RDI + 0x12) & 4) == 0) {
        if ((*(long *)(in_RDI + 0x40) != 0) && (*(long *)(in_RDI + 0x48) != 0)) {
          eVar1 = decompress_data((exr_const_context_t)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  (exr_compression_t)((ulong)in_RDI >> 0x20),
                                  (exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffe8,
                                  packbufptr,packsz,in_stack_ffffffffffffffd0,(size_t)part);
        }
        if (eVar1 == 0) {
          eVar1 = 0;
        }
        else {
          eVar1 = (**(code **)((long)packbufptr + 0x48))
                            (packbufptr,eVar1,
                             "Unable to decompress w %d image data %lu -> %lu, got %lu",
                             *(undefined4 *)(packsz + 0xb0),*(undefined8 *)(in_RDI + 0x40),
                             *(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x68));
        }
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_uncompress_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t    rv   = EXR_ERR_SUCCESS;
    exr_context_t   ctxt;
    exr_priv_part_t part;

    if (!decode) return EXR_ERR_MISSING_CONTEXT_ARG;

    decode->bytes_decompressed = 0;

    ctxt = (exr_context_t)decode->context;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* TODO: Double check need for a lock? */
    if (decode->part_index < 0 || decode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            decode->part_index);

    part = ctxt->parts[decode->part_index];

//    if (decode->chunk.unpacked_size != part->unpacked_size_per_chunk)
//        return ctxt->print_error (
//            ctxt,
//            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
//            "Memory not sufficient to unpack a full part, expect %" PRIu64 ", given %" PRIu64,
//            part->unpacked_size_per_chunk,
//            decode->chunk.unpacked_size);

    if (decode->packed_sample_count_table)
    {
        uint64_t sampsize =
            (((uint64_t) decode->chunk.width) *
             ((uint64_t) decode->chunk.height));

        sampsize *= sizeof (int32_t);

        rv = decompress_data (
            ctxt,
            part->comp_type,
            decode,
            decode->packed_sample_count_table,
            decode->chunk.sample_count_table_size,
            decode->sample_count_table,
            sampsize);

        if (rv != EXR_ERR_SUCCESS)
        {
            return ctxt->print_error (
                ctxt,
                rv,
                "Unable to decompress sample table %" PRIu64 " -> %" PRIu64,
                decode->chunk.sample_count_table_size,
                (uint64_t) sampsize);
        }
    }

    if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;

    if (rv == EXR_ERR_SUCCESS &&
        decode->chunk.packed_size > 0 &&
        decode->chunk.unpacked_size > 0)
        rv = decompress_data (
            ctxt,
            part->comp_type,
            decode,
            decode->packed_buffer,
            decode->chunk.packed_size,
            decode->unpacked_buffer,
            decode->chunk.unpacked_size);

    if (rv != EXR_ERR_SUCCESS)
    {
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to decompress w %d image data %" PRIu64 " -> %" PRIu64 ", got %" PRIu64,
            (int)part->comp_type,
            decode->chunk.packed_size,
            decode->chunk.unpacked_size,
            decode->bytes_decompressed);
    }
    return rv;
}